

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

bool * boost::any_cast<bool_const&>(any *operand)

{
  bad_any_cast *in_stack_00000010;
  nonref *result;
  any *in_stack_ffffffffffffffd0;
  bad_any_cast local_18;
  bool *local_10;
  
  local_10 = any_cast<bool_const>(in_stack_ffffffffffffffd0);
  if (local_10 == (bool *)0x0) {
    local_18 = (bad_any_cast)0x0;
    bad_any_cast::bad_any_cast(&local_18);
    throw_exception<boost::bad_any_cast>(in_stack_00000010);
  }
  return local_10;
}

Assistant:

ValueType any_cast(any & operand)
    {
        typedef BOOST_DEDUCED_TYPENAME remove_reference<ValueType>::type nonref;

#ifdef BOOST_NO_TEMPLATE_PARTIAL_SPECIALIZATION
        // If 'nonref' is still reference type, it means the user has not
        // specialized 'remove_reference'.

        // Please use BOOST_BROKEN_COMPILER_TYPE_TRAITS_SPECIALIZATION macro
        // to generate specialization of remove_reference for your class
        // See type traits library documentation for details
        BOOST_STATIC_ASSERT(!is_reference<nonref>::value);
#endif

        nonref * result = any_cast<nonref>(&operand);
        if(!result)
            boost::throw_exception(bad_any_cast());

        // Attempt to avoid construction of a temporary object in cases when 
        // `ValueType` is not a reference. Example:
        // `static_cast<std::string>(*result);` 
        // which is equal to `std::string(*result);`
        typedef BOOST_DEDUCED_TYPENAME boost::mpl::if_<
            boost::is_reference<ValueType>,
            ValueType,
            BOOST_DEDUCED_TYPENAME boost::add_reference<ValueType>::type
        >::type ref_type;

        return static_cast<ref_type>(*result);
    }